

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdb_typetable.cpp
# Opt level: O1

void __thiscall TypeTable::TypeTable(TypeTable *this,TPIStream *tpiStream)

{
  Record **ppRVar1;
  ulong uVar2;
  ulong uVar3;
  size_t offset;
  RecordHeader data;
  CoalescedMSFStream local_48;
  
  this->typeIndexBegin = (tpiStream->m_header).typeIndexBegin;
  this->typeIndexEnd = (tpiStream->m_header).typeIndexEnd;
  this->m_recordCount = tpiStream->m_recordCount;
  PDB::CoalescedMSFStream::CoalescedMSFStream(&this->m_stream);
  PDB::CoalescedMSFStream::CoalescedMSFStream
            (&local_48,&tpiStream->m_stream,(tpiStream->m_stream).m_size,0);
  PDB::CoalescedMSFStream::operator=(&this->m_stream,&local_48);
  PDB::CoalescedMSFStream::~CoalescedMSFStream(&local_48);
  ppRVar1 = (Record **)
            operator_new__(-(ulong)(this->m_recordCount >> 0x3d != 0) | this->m_recordCount << 3);
  this->m_records = ppRVar1;
  if (0x38 < (tpiStream->m_stream).m_size) {
    uVar3 = 0;
    offset = 0x38;
    do {
      PDB::DirectMSFStream::ReadAtOffset(&tpiStream->m_stream,&local_48,4,offset);
      uVar2 = (ushort)local_48.m_ownedData + offset + 2;
      this->m_records[uVar3] = (Record *)((this->m_stream).m_data + offset);
      uVar3 = (ulong)((int)uVar3 + 1);
      offset = uVar2;
    } while (uVar2 < (tpiStream->m_stream).m_size);
  }
  return;
}

Assistant:

TypeTable::TypeTable(const PDB::TPIStream& tpiStream) PDB_NO_EXCEPT
	: typeIndexBegin(tpiStream.GetFirstTypeIndex()), typeIndexEnd(tpiStream.GetLastTypeIndex()),
	m_recordCount(tpiStream.GetTypeRecordCount())
{
	// Create coalesced stream from TPI stream, so the records can be referenced directly using pointers.
	const PDB::DirectMSFStream& directStream = tpiStream.GetDirectMSFStream();
	m_stream = PDB::CoalescedMSFStream(directStream, directStream.GetSize(), 0);

	// types in the TPI stream are accessed by their index from other streams.
	// however, the index is not stored with types in the TPI stream directly, but has to be built while walking the stream.
	// similarly, because types are variable-length records, there are no direct offsets to access individual types.
	// we therefore walk the TPI stream once, and store pointers to the records for trivial O(1) array lookup by index later.	
	m_records = new const PDB::CodeView::TPI::Record*[m_recordCount];

	// parse the CodeView records
	uint32_t typeIndex = 0u;

	tpiStream.ForEachTypeRecordHeaderAndOffset([this, &typeIndex](const PDB::CodeView::TPI::RecordHeader& header, size_t offset)
		{
			// The header includes the record kind and size, which can be stored along with offset
			// to allow for lazy loading of the types on-demand directly from the TPIStream::GetDirectMSFStream()
			// using DirectMSFStream::ReadAtOffset(...). Thus not needing a CoalescedMSFStream to look up the types.
			(void)header;

			const PDB::CodeView::TPI::Record* record = m_stream.GetDataAtOffset<const PDB::CodeView::TPI::Record>(offset);
			m_records[typeIndex] = record;
			++typeIndex;
		});
}